

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalTersePrinter<const_char_*>::Print(char *str,ostream *os)

{
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ostream *local_18;
  ostream *os_local;
  char *str_local;
  
  local_18 = os;
  os_local = (ostream *)str;
  if (str == (char *)0x0) {
    std::operator<<(os,"NULL");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,str,&local_39);
    UniversalPrint<std::__cxx11::string>(&local_38,local_18);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

static void Print(const char* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(std::string(str), os);
    }
  }